

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

PNode * add_PNode(Parser *p,int symbol,d_loc_t *start_loc,char *e,PNode *pn,D_Reduction *r,
                 VecZNode *path,D_Shift *sh)

{
  VecPNode *v;
  uint32 *puVar1;
  AssocKind cassoc;
  D_ReductionCode p_Var2;
  PNode **ppPVar3;
  PNode **ppPVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  PNode *pPVar9;
  int iVar10;
  uint uVar11;
  PNode *pPVar12;
  PNode *pPVar13;
  char *pcVar14;
  PNode *pPVar15;
  ulong uVar16;
  PNode *_t;
  PNode *pPVar17;
  uint i;
  uint uVar18;
  PNode *_t_1;
  uint hash;
  VecPNode vx;
  uint local_a4;
  PNode *local_a0;
  D_Scope *local_98;
  VecPNode local_90;
  undefined1 local_68 [24];
  PNode *pPStack_50;
  PNode *local_48;
  undefined8 uStack_40;
  D_ReductionCode *local_38;
  
  local_98 = equiv_D_Scope((pn->parse_node).scope);
  pPVar12 = find_PNode(p,start_loc->s,e,symbol,local_98,&local_a4);
  if (pPVar12 != (PNode *)0x0) {
    iVar10 = PNode_equal(p,pPVar12,r,path,sh);
    pPVar13 = pPVar12;
    while( true ) {
      if (iVar10 != 0) {
        return pPVar12;
      }
      pPVar13 = pPVar13->ambiguities;
      if (pPVar13 == (PNode *)0x0) break;
      iVar10 = PNode_equal(p,pPVar13,r,path,sh);
    }
  }
  pPVar13 = p->free_pnodes;
  uVar16 = (ulong)((p->user).sizeof_user_parse_node + 0xd0);
  local_a0 = pPVar12;
  if (pPVar13 == (PNode *)0x0) {
    pPVar13 = (PNode *)malloc(uVar16);
  }
  else {
    p->free_pnodes = pPVar13->all_next;
  }
  p->pnodes = p->pnodes + 1;
  memset(pPVar13,0,uVar16);
  pPVar13->hash = local_a4;
  (pPVar13->parse_node).symbol = symbol;
  pcVar14 = start_loc->pathname;
  uVar6 = *(undefined4 *)&start_loc->ws;
  uVar7 = *(undefined4 *)((long)&start_loc->ws + 4);
  iVar10 = start_loc->col;
  iVar8 = start_loc->line;
  (pPVar13->parse_node).start_loc.s = start_loc->s;
  (pPVar13->parse_node).start_loc.pathname = pcVar14;
  *(undefined4 *)&(pPVar13->parse_node).start_loc.ws = uVar6;
  *(undefined4 *)((long)&(pPVar13->parse_node).start_loc.ws + 4) = uVar7;
  (pPVar13->parse_node).start_loc.col = iVar10;
  (pPVar13->parse_node).start_loc.line = iVar8;
  pPVar13->ws_before = start_loc->ws;
  pcVar14 = e;
  if (path != (VecZNode *)0x0 && r != (D_Reduction *)0x0) {
    pcVar14 = (pn->parse_node).end;
  }
  (pPVar13->parse_node).end = pcVar14;
  (pPVar13->parse_node).end_skip = e;
  pPVar13->shift = sh;
  pPVar13->reduction = r;
  (pPVar13->parse_node).scope = (pn->parse_node).scope;
  pPVar13->initial_scope = local_98;
  pPVar13->latest = pPVar13;
  pPVar13->ws_after = e;
  if (sh == (D_Shift *)0x0) {
    if (r != (D_Reduction *)0x0) {
      if ((path != (VecZNode *)0x0) && (uVar11 = path->n - 1, -1 < (int)uVar11)) {
        v = &pPVar13->children;
        ppPVar4 = (pPVar13->children).e;
        uVar16 = (ulong)uVar11;
        do {
          pPVar12 = path->v[uVar16]->pn;
          pPVar17 = pPVar12->latest;
          pPVar9 = pPVar17->latest;
          pPVar15 = pPVar17;
          if (pPVar17 != pPVar17->latest) {
            do {
              pPVar17 = pPVar9;
              pPVar17->refcount = pPVar17->refcount + 1;
              puVar1 = &pPVar15->refcount;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) {
                free_PNode(p,pPVar15);
              }
              pPVar12->latest = pPVar17;
              pPVar9 = pPVar17->latest;
              pPVar15 = pPVar17;
            } while (pPVar17 != pPVar17->latest);
          }
          pPVar17->refcount = pPVar17->refcount + 1;
          ppPVar3 = (pPVar13->children).v;
          if (ppPVar3 == (PNode **)0x0) {
            (pPVar13->children).v = ppPVar4;
            uVar11 = (pPVar13->children).n;
            (pPVar13->children).n = uVar11 + 1;
            (pPVar13->children).e[uVar11] = pPVar17;
          }
          else {
            uVar11 = v->n;
            if (ppPVar3 == ppPVar4) {
              if (2 < uVar11) goto LAB_00147458;
            }
            else if ((uVar11 & 7) == 0) {
LAB_00147458:
              vec_add_internal(v,pPVar17);
              goto LAB_00147463;
            }
            v->n = uVar11 + 1;
            ppPVar3[uVar11] = pPVar17;
          }
LAB_00147463:
          bVar5 = 0 < (long)uVar16;
          uVar16 = uVar16 - 1;
        } while (bVar5);
      }
      uVar11 = (pPVar13->children).n;
      if ((ulong)uVar11 == 0) {
        uVar18 = 0;
      }
      else {
        ppPVar4 = (pPVar13->children).v;
        uVar16 = 0;
        uVar18 = 0;
        do {
          pPVar12 = ppPVar4[uVar16];
          if (pPVar12->op_assoc != ASSOC_NONE) {
            pPVar13->assoc = pPVar12->op_assoc;
            pPVar13->priority = pPVar12->op_priority;
          }
          if (uVar18 <= pPVar12->height) {
            uVar18 = pPVar12->height + 1;
          }
          uVar16 = uVar16 + 1;
        } while (uVar11 != uVar16);
      }
      pPVar13->op_assoc = (uint)r->op_assoc;
      pPVar13->op_priority = r->op_priority;
      pPVar13->height = uVar18;
      if (r->rule_assoc != 0) {
        pPVar13->assoc = (uint)r->rule_assoc;
        pPVar13->priority = r->rule_priority;
      }
      if ((r->speculative_code != (D_ReductionCode)0x0) &&
         (iVar10 = (*r->speculative_code)(pPVar13,(pPVar13->children).v,uVar11,0x90,&p->user),
         iVar10 != 0)) {
LAB_00147526:
        free_PNode(p,pPVar13);
        goto LAB_00147531;
      }
      if ((path != (VecZNode *)0x0) && (uVar11 = path->n, 1 < uVar11)) {
        ppPVar4 = (pPVar13->children).v;
        uVar16 = 0;
        do {
          pPVar12 = ppPVar4[uVar16];
          cassoc = pPVar12->assoc;
          if (((cassoc != ASSOC_NONE) && (pPVar13->assoc != ASSOC_NONE)) &&
             (iVar10 = check_child(pPVar13->priority,pPVar13->assoc,pPVar12->priority,cassoc,
                                   (uint)(uVar11 - 1 == (int)uVar16),(int)r), iVar10 == 0))
          goto LAB_00147526;
          uVar18 = (int)uVar16 + (uVar11 - 1);
          uVar16 = (ulong)uVar18;
        } while (uVar18 < uVar11);
      }
    }
  }
  else {
    pPVar13->op_assoc = (uint)sh->op_assoc;
    pPVar13->op_priority = sh->op_priority;
    p_Var2 = sh->speculative_code;
    if ((p_Var2 != (D_ReductionCode)0x0) && (sh->action_index != 0xffffffff)) {
      uStack_40._0_4_ = 0;
      uStack_40._4_4_ = 0;
      local_68._16_8_ = (PNode *)0x0;
      pPStack_50 = (PNode *)0x0;
      local_68._0_8_ = 0;
      local_68._8_8_ = (PNode **)0x0;
      local_38 = (D_ReductionCode *)0x0;
      local_48 = (PNode *)((ulong)(uint)sh->action_index << 0x20);
      pPVar13->reduction = (D_Reduction *)local_68;
      iVar10 = (*p_Var2)(pPVar13,(pPVar13->children).v,(pPVar13->children).n,0x90,&p->user);
      if (iVar10 == 0) {
        pPVar13->reduction = (D_Reduction *)0x0;
      }
      else {
        free_PNode(p,pPVar13);
LAB_00147531:
        pPVar13 = (PNode *)0x0;
      }
    }
  }
  pPVar12 = local_a0;
  if (local_a0 == (PNode *)0x0) {
    if (pPVar13 != (PNode *)0x0) {
      insert_PNode_internal(p,pPVar13);
      pPVar13->refcount = pPVar13->refcount + 1;
      pPVar13->all_next = (p->pnode_hash).all;
      (p->pnode_hash).all = pPVar13;
      return pPVar13;
    }
    return (PNode *)0x0;
  }
  if (pPVar13 == (PNode *)0x0) {
    return local_a0;
  }
  p->compares = p->compares + 1;
  if ((((p->user).dont_use_deep_priorities_for_disambiguation == 0) &&
      (pPVar13->assoc != ASSOC_NONE)) && (local_a0->assoc != ASSOC_NONE)) {
    local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
    local_68._8_8_ = (PNode **)0x0;
    local_90.n = 0;
    local_90.v = (PNode **)0x0;
    get_unshared_pnodes(p,pPVar13,local_a0,(VecPNode *)local_68,&local_90);
    if ((PNode **)local_68._8_8_ != (PNode **)0x0) {
      qsort((void *)local_68._8_8_,local_68._0_8_ & 0xffffffff,8,prioritycmp);
    }
    if (local_90.v != (PNode **)0x0) {
      qsort(local_90.v,(ulong)local_90.n,8,prioritycmp);
    }
    bVar5 = true;
    if ((local_68._0_8_ & 0xffffffff) != 0) {
      iVar10 = 0;
      uVar16 = 0;
      do {
        if (local_90.n == uVar16) goto LAB_00147727;
        if (local_90.v[uVar16]->priority < (*(PNode **)(local_68._8_8_ + uVar16 * 8))->priority) {
          iVar10 = -1;
LAB_00147725:
          bVar5 = false;
          goto LAB_00147727;
        }
        if ((*(PNode **)(local_68._8_8_ + uVar16 * 8))->priority < local_90.v[uVar16]->priority) {
          iVar10 = 1;
          goto LAB_00147725;
        }
        uVar16 = uVar16 + 1;
      } while ((local_68._0_8_ & 0xffffffff) != uVar16);
    }
    iVar10 = 0;
LAB_00147727:
    if ((undefined1 *)local_68._8_8_ != local_68 + 0x10 && (PNode **)local_68._8_8_ != (PNode **)0x0
       ) {
      free((void *)local_68._8_8_);
    }
    local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
    local_68._8_8_ = (PNode **)0x0;
    if (local_90.v != local_90.e && local_90.v != (PNode **)0x0) {
      free(local_90.v);
    }
    if (!bVar5) goto LAB_00147781;
  }
  if (((p->user).dont_use_greediness_for_disambiguation != 0) ||
     (iVar10 = cmp_greediness(p,pPVar13,pPVar12), iVar10 == 0)) {
    if ((p->user).dont_use_height_for_disambiguation == 0) {
      iVar10 = -1;
      if ((pPVar13->height < pPVar12->height) || (iVar10 = 1, pPVar12->height < pPVar13->height))
      goto LAB_00147781;
    }
    iVar10 = 0;
  }
LAB_00147781:
  if (iVar10 == -1) {
    insert_PNode_internal(p,pPVar13);
    pPVar13->refcount = pPVar13->refcount + 1;
    pPVar13->all_next = (p->pnode_hash).all;
    (p->pnode_hash).all = pPVar13;
    pPVar17 = pPVar12->latest;
    pPVar9 = pPVar17->latest;
    pPVar15 = pPVar17;
    if (pPVar17 != pPVar17->latest) {
      do {
        pPVar17 = pPVar9;
        pPVar17->refcount = pPVar17->refcount + 1;
        puVar1 = &pPVar15->refcount;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          free_PNode(p,pPVar15);
        }
        pPVar12->latest = pPVar17;
        pPVar9 = pPVar17->latest;
        pPVar15 = pPVar17;
      } while (pPVar17 != pPVar17->latest);
    }
    pPVar13->refcount = pPVar13->refcount + 1;
    pPVar17->latest = pPVar13;
    pPVar12 = pPVar13;
  }
  else if (iVar10 == 1) {
    free_PNode(p,pPVar13);
  }
  else {
    pPVar13->refcount = pPVar13->refcount + 1;
    pPVar13->ambiguities = pPVar12->ambiguities;
    pPVar12->ambiguities = pPVar13;
  }
  return pPVar12;
}

Assistant:

static PNode *add_PNode(Parser *p, int symbol, d_loc_t *start_loc, char *e, PNode *pn, D_Reduction *r, VecZNode *path,
                        D_Shift *sh) {
  D_Scope *scope = equiv_D_Scope(pn->parse_node.scope);
  uint hash;
  PNode *old_pn = find_PNode(p, start_loc->s, e, symbol, scope, &hash), *new_pn;
  if (old_pn) {
    PNode *amb = 0;
    if (PNode_equal(p, old_pn, r, path, sh)) return old_pn;
    for (amb = old_pn->ambiguities; amb; amb = amb->ambiguities) {
      if (PNode_equal(p, amb, r, path, sh)) return old_pn;
    }
  }
  new_pn = make_PNode(p, hash, symbol, start_loc, e, pn, r, path, sh, scope);
  if (!old_pn) {
    old_pn = new_pn;
    if (!new_pn) return NULL;
    insert_PNode(p, new_pn);
    goto Lreturn;
  }
  if (!new_pn) goto Lreturn;
  p->compares++;
  switch (cmp_pnodes(p, new_pn, old_pn)) {
    case 0:
      ref_pn(new_pn);
      new_pn->ambiguities = old_pn->ambiguities;
      old_pn->ambiguities = new_pn;
      break;
    case -1:
      insert_PNode(p, new_pn);
      LATEST(p, old_pn);
      ref_pn(new_pn);
      old_pn->latest = new_pn;
      old_pn = new_pn;
      break;
    case 1:
      free_PNode(p, new_pn);
      break;
  }
Lreturn:
  return old_pn;
}